

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussIntegrationRule.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChGaussIntegrationRule::SetIntOnCube
          (ChGaussIntegrationRule *this,int nPoints,
          vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          *GpVector)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChGaussPoint *pCVar4;
  ChLog *this_00;
  ChStreamOutAscii *this_01;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  ChVector<double> coord;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> c;
  ChVector<double> local_98;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_58;
  vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_> *local_40;
  long local_38;
  
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 0.0;
  local_98.m_data[2] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_40 = GpVector;
  std::vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>::resize
            (GpVector,(long)nPoints);
  if (nPoints < 0x1b) {
    if (nPoints == 1) {
      local_98.m_data[0] = 0.0;
      local_98.m_data[1] = 0.0;
      local_98.m_data[2] = 0.0;
      pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
      ChGaussPoint::ChGaussPoint(pCVar4,1,&local_98,8.0);
      *(local_40->
       super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
       )._M_impl.super__Vector_impl_data._M_start = pCVar4;
      goto LAB_00615783;
    }
    if (nPoints == 8) {
      std::vector<double,_std::allocator<double>_>::resize(&local_58,2);
      std::vector<double,_std::allocator<double>_>::resize(&local_78,2);
      *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.577350269189626;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.577350269189626;
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 1.0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 1.0;
      iVar8 = 1;
      lVar10 = 0;
      lVar6 = 0;
      do {
        lVar11 = 0;
        local_38 = lVar10;
        iVar9 = iVar8;
        do {
          lVar5 = 0;
          do {
            local_98.m_data[0] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
            local_98.m_data[1] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
            local_98.m_data[2] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5];
            dVar1 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6];
            dVar2 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
            dVar3 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
            pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
            ChGaussPoint::ChGaussPoint(pCVar4,iVar9 + (int)lVar5,&local_98,dVar2 * dVar1 * dVar3);
            *(ChGaussPoint **)
             ((long)(local_40->
                    super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + lVar5 * 8 + lVar10) = pCVar4;
            lVar5 = lVar5 + 1;
          } while (lVar5 == 1);
          iVar9 = iVar9 + 2;
          lVar10 = lVar10 + 0x10;
          bVar13 = lVar11 == 0;
          lVar11 = lVar11 + 1;
        } while (bVar13);
        iVar8 = iVar8 + 4;
        lVar10 = local_38 + 0x20;
        bVar13 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar13);
      goto LAB_00615783;
    }
  }
  else {
    if (nPoints == 0x1b) {
      std::vector<double,_std::allocator<double>_>::resize(&local_58,3);
      std::vector<double,_std::allocator<double>_>::resize(&local_78,3);
      *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.774596669241483;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.774596669241483;
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 0.555555555555555;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.888888888888888;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.555555555555555;
      lVar6 = 0;
      lVar10 = 0;
      do {
        lVar5 = 0;
        lVar11 = lVar6;
        do {
          lVar12 = 0;
          lVar7 = lVar11;
          do {
            local_98.m_data[0] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
            local_98.m_data[1] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5];
            local_98.m_data[2] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
            dVar1 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10];
            dVar2 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
            dVar3 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12];
            pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
            ChGaussPoint::ChGaussPoint(pCVar4,(int)lVar7 + 1,&local_98,dVar2 * dVar1 * dVar3);
            (local_40->
            super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
            )._M_impl.super__Vector_impl_data._M_start[lVar7] = pCVar4;
            lVar12 = lVar12 + 1;
            lVar7 = lVar7 + 1;
          } while (lVar12 != 3);
          lVar5 = lVar5 + 1;
          lVar11 = lVar11 + 3;
        } while (lVar5 != 3);
        lVar10 = lVar10 + 1;
        lVar6 = lVar6 + 9;
      } while (lVar10 != 3);
      goto LAB_00615783;
    }
    if (nPoints == 0x40) {
      std::vector<double,_std::allocator<double>_>::resize(&local_58,4);
      std::vector<double,_std::allocator<double>_>::resize(&local_78,4);
      *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.861136311594053;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = -0.339981043584856;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.339981043584856;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.861136311594053;
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 0.347854845137454;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.652145154862546;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.652145154862546;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.347854845137454;
      iVar8 = 1;
      lVar10 = 0;
      lVar6 = 0;
      do {
        lVar11 = 0;
        local_38 = lVar10;
        iVar9 = iVar8;
        do {
          lVar5 = 0;
          do {
            local_98.m_data[0] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
            local_98.m_data[1] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
            local_98.m_data[2] =
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5];
            dVar1 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6];
            dVar2 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
            dVar3 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
            pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
            ChGaussPoint::ChGaussPoint(pCVar4,iVar9 + (int)lVar5,&local_98,dVar2 * dVar1 * dVar3);
            *(ChGaussPoint **)
             ((long)(local_40->
                    super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + lVar5 * 8 + lVar10) = pCVar4;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          lVar11 = lVar11 + 1;
          iVar9 = iVar9 + 4;
          lVar10 = lVar10 + 0x20;
        } while (lVar11 != 4);
        lVar6 = lVar6 + 1;
        iVar8 = iVar8 + 0x10;
        lVar10 = local_38 + 0x80;
      } while (lVar6 != 4);
      goto LAB_00615783;
    }
  }
  this_00 = GetLog();
  this_01 = ChStreamOutAscii::operator<<
                      (&this_00->super_ChStreamOutAscii,
                       "SetIntOnCube: unsupported number of integration points: ");
  ChStreamOutAscii::operator<<(this_01,nPoints);
LAB_00615783:
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChGaussIntegrationRule::SetIntOnCube(int nPoints, std::vector<ChGaussPoint*>* GpVector) {
    int i, j, k;
    double weight;
    ChVector<> coord;
    std::vector<double> c, w;

    // Resize the vector containing Gauss Points
    // GpVector = new std::vector<ChGaussPoint> [ nPoints ];
    (*GpVector).resize(nPoints);

    switch (nPoints) {
        case 1:

            coord.x() = 0.0;
            coord.y() = 0.0;
            coord.z() = 0.0;
            weight = 8.0;
            (*GpVector)[0] = new ChGaussPoint(1, &coord, weight);
            break;

        case 8:

            c.resize(2);
            w.resize(2);
            c[0] = -0.577350269189626;
            c[1] = 0.577350269189626;

            w[0] = 1.0;
            w[1] = 1.0;

            for (i = 0; i < 2; i++) {
                for (j = 0; j < 2; j++) {
                    for (k = 0; k < 2; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        // ChGaussPoint* my_gp = new ChGaussPoint( 4 *i + 2 *j + k , &coord, weight);
                        (*GpVector)[4 * i + 2 * j + k] = new ChGaussPoint(4 * i + 2 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        case 27:

            c.resize(3);
            w.resize(3);
            c[0] = -0.774596669241483;
            c[1] = 0.0;
            c[2] = 0.774596669241483;

            w[0] = 0.555555555555555;
            w[1] = 0.888888888888888;
            w[2] = 0.555555555555555;

            for (i = 0; i < 3; i++) {
                for (j = 0; j < 3; j++) {
                    for (k = 0; k < 3; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        (*GpVector)[9 * i + 3 * j + k] = new ChGaussPoint(9 * i + 3 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        case 64:

            c.resize(4);
            w.resize(4);
            c[0] = -0.861136311594053;
            c[1] = -0.339981043584856;
            c[2] = 0.339981043584856;
            c[3] = 0.861136311594053;

            w[0] = 0.347854845137454;
            w[1] = 0.652145154862546;
            w[2] = 0.652145154862546;
            w[3] = 0.347854845137454;

            for (i = 0; i < 4; i++) {
                for (j = 0; j < 4; j++) {
                    for (k = 0; k < 4; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        (*GpVector)[16 * i + 4 * j + k] = new ChGaussPoint(16 * i + 4 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        default:
            GetLog() << "SetIntOnCube: unsupported number of integration points: " << nPoints;

    }  //__end of Switch
}